

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

AggregateFunction * duckdb::MedianFun::GetFunctions(void)

{
  AggregateFunction *in_RDI;
  AggregateFunctionSet *set;
  AggregateFunction *this;
  LogicalType local_1c0 [24];
  LogicalType local_1a8 [24];
  LogicalType local_190 [184];
  LogicalType *in_stack_ffffffffffffff28;
  LogicalType *in_stack_ffffffffffffff30;
  LogicalType *in_stack_ffffffffffffff38;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  this = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"median",&local_31);
  duckdb::AggregateFunctionSet::AggregateFunctionSet((AggregateFunctionSet *)in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  duckdb::LogicalType::LogicalType(local_190,ANY);
  duckdb::LogicalType::LogicalType(local_1a8,ANY);
  duckdb::LogicalType::LogicalType(local_1c0,INVALID);
  EmptyQuantileFunction<duckdb::MedianFunction>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_RDI);
  AggregateFunction::~AggregateFunction(this);
  duckdb::LogicalType::~LogicalType(local_1c0);
  duckdb::LogicalType::~LogicalType(local_1a8);
  duckdb::LogicalType::~LogicalType(local_190);
  return this;
}

Assistant:

AggregateFunctionSet MedianFun::GetFunctions() {
	AggregateFunctionSet set("median");
	set.AddFunction(EmptyQuantileFunction<MedianFunction>(LogicalType::ANY, LogicalType::ANY, LogicalTypeId::INVALID));
	return set;
}